

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParser
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  bool bVar2;
  char *local_20;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  local_20 = "private";
  if (*(int *)(*(long *)(pDVar1 + 0x10) + 0x3c) == 2) {
    local_20 = "@java.lang.Deprecated public";
  }
  io::Printer::Print<char[11],char_const*,char[10],std::__cxx11::string>
            (printer,
             "$visibility$ static final com.google.protobuf.Parser<$classname$>\n    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n"
             ,(char (*) [11])"visibility",&local_20,(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pDVar1);
  io::Printer::Indent(printer);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\npublic $classname$ parsePartialFrom(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
             ,(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  bVar2 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"  return new $classname$(input, extensionRegistry);\n",
               (char (*) [10])0x3aca6c,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (this->super_MessageGenerator).descriptor_);
  }
  else {
    io::Printer::Indent(printer);
    io::Printer::Print<>
              (printer,
               "Builder builder = newBuilder();\ntry {\n  builder.mergeFrom(input, extensionRegistry);\n} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(builder.buildPartial());\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e.getMessage()).setUnfinishedMessage(\n          builder.buildPartial());\n}\nreturn builder.buildPartial();\n"
              );
    io::Printer::Outdent(printer);
  }
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"};\n\n");
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static com.google.protobuf.Parser<$classname$> parser() {\n  return PARSER;\n}\n\n@java.lang.Override\npublic com.google.protobuf.Parser<$classname$> getParserForType() {\n  return PARSER;\n}\n\n"
             ,(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "$visibility$ static final com.google.protobuf.Parser<$classname$>\n"
      "    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n",
      "visibility",
      ExposePublicParser(descriptor_->file()) ? "@java.lang.Deprecated public"
                                              : "private",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ parsePartialFrom(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print("  return new $classname$(input, extensionRegistry);\n",
                   "classname", descriptor_->name());
  } else {
    // When parsing constructor isn't generated, use builder to parse
    // messages. Note, will fallback to use reflection based mergeFieldFrom()
    // in AbstractMessage.Builder.
    printer->Indent();
    printer->Print(
        "Builder builder = newBuilder();\n"
        "try {\n"
        "  builder.mergeFrom(input, extensionRegistry);\n"
        "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
        "  throw e.setUnfinishedMessage(builder.buildPartial());\n"
        "} catch (java.io.IOException e) {\n"
        "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
        "      e.getMessage()).setUnfinishedMessage(\n"
        "          builder.buildPartial());\n"
        "}\n"
        "return builder.buildPartial();\n");
    printer->Outdent();
  }
  printer->Print("}\n");
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  printer->Print(
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public com.google.protobuf.Parser<$classname$> getParserForType() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());
}